

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O0

KDop<24U> * __thiscall NBvh3::KDop<24U>::operator+=(KDop<24U> *this,KDop<24U> *other)

{
  uint local_1c;
  uint i;
  KDop<24U> *other_local;
  KDop<24U> *this_local;
  
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    if (other->mMin[local_1c] < this->mMin[local_1c]) {
      this->mMin[local_1c] = other->mMin[local_1c];
    }
    if (this->mMax[local_1c] <= other->mMax[local_1c] &&
        other->mMax[local_1c] != this->mMax[local_1c]) {
      this->mMax[local_1c] = other->mMax[local_1c];
    }
  }
  return this;
}

Assistant:

KDop<K>& KDop<K>::operator += (const KDop<K>& other)
{
    for (unsigned i = 0; i < K / 2; ++i)
    {
        if (other.mMin[i] < mMin[i])
        {
            mMin[i] = other.mMin[i];
        }

        if (other.mMax[i] > mMax[i])
        {
            mMax[i] = other.mMax[i];
        }
    }

    return *this;
}